

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirDEFDEVICE(void)

{
  int badValue;
  pointer ppCVar1;
  bool bVar2;
  int iVar3;
  char *__s1;
  CDeviceDef *pCVar4;
  long lVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  char *message;
  bool optional [258];
  aint args [258];
  CDeviceDef *local_550;
  bool local_548 [2];
  undefined1 local_546 [270];
  int local_438;
  int local_434;
  int local_430 [256];
  
  __s1 = GetID(&lp);
  ppCVar1 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__s1 == (char *)0x0) {
    Error("[DEFDEVICE] expected syntax is <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]"
          ,bp,SUPPRESS);
    return;
  }
  lVar5 = (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 5;
  ppCVar7 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < lVar5) {
    ppCVar7 = (pointer)(((long)DefDevices.
                               super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)DefDevices.
                               super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>.
                               _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0U) +
                       (long)DefDevices.
                             super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl
                             .super__Vector_impl_data._M_start);
    lVar5 = lVar5 + 1;
    ppCVar6 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
              super__Vector_impl_data._M_start + 2;
    do {
      iVar3 = strcasecmp(__s1,ppCVar6[-2]->ID);
      if (iVar3 == 0) {
        ppCVar6 = ppCVar6 + -2;
        goto LAB_00111c4c;
      }
      iVar3 = strcasecmp(__s1,ppCVar6[-1]->ID);
      if (iVar3 == 0) {
        ppCVar6 = ppCVar6 + -1;
        goto LAB_00111c4c;
      }
      iVar3 = strcasecmp(__s1,(*ppCVar6)->ID);
      if (iVar3 == 0) goto LAB_00111c4c;
      iVar3 = strcasecmp(__s1,ppCVar6[1]->ID);
      if (iVar3 == 0) {
        ppCVar6 = ppCVar6 + 1;
        goto LAB_00111c4c;
      }
      lVar5 = lVar5 + -1;
      ppCVar6 = ppCVar6 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)ppCVar1 - (long)ppCVar7 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      ppCVar6 = ppCVar1;
      if ((lVar5 != 3) || (iVar3 = strcasecmp(__s1,(*ppCVar7)->ID), ppCVar6 = ppCVar7, iVar3 == 0))
      goto LAB_00111c4c;
      ppCVar7 = ppCVar7 + 1;
    }
    iVar3 = strcasecmp(__s1,(*ppCVar7)->ID);
    ppCVar6 = ppCVar7;
    if (iVar3 == 0) goto LAB_00111c4c;
    ppCVar7 = ppCVar7 + 1;
  }
  iVar3 = strcasecmp(__s1,(*ppCVar7)->ID);
  ppCVar6 = ppCVar7;
  if (iVar3 != 0) {
    ppCVar6 = ppCVar1;
  }
LAB_00111c4c:
  if (1 < pass || ppCVar6 != ppCVar1) {
    if (pass < 2) {
      Error("[DEFDEVICE] device with such ID is already defined",__s1,EARLY);
    }
    SkipToEol(&lp);
    return;
  }
  memset(&local_438,0,0x408);
  memset(local_548,0,0x102);
  memset(local_430,0xff,0x3f8);
  memset(local_546,1,0xfe);
  bVar2 = anyComma(&lp);
  message = 
  "[DEFDEVICE] expected syntax is <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]"
  ;
  if ((bVar2) &&
     (bVar2 = getIntArguments<258>(&lp,(aint (*) [258])&local_438,(bool (*) [258])local_548), bVar2)
     ) {
    if (0 < local_434 && 0xffff00fe < local_438 - 0x10001U) {
      pCVar4 = (CDeviceDef *)operator_new(0x418);
      CDeviceDef::CDeviceDef(pCVar4,__s1,local_438,local_434);
      local_550 = pCVar4;
      std::vector<CDeviceDef*,std::allocator<CDeviceDef*>>::emplace_back<CDeviceDef*>
                ((vector<CDeviceDef*,std::allocator<CDeviceDef*>> *)&DefDevices,&local_550);
      pCVar4 = DefDevices.super__Vector_base<CDeviceDef_*,_std::allocator<CDeviceDef_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
      if (pCVar4->SlotsCount < 1) {
        return;
      }
      iVar3 = -1;
      lVar5 = 0;
      do {
        badValue = local_430[lVar5];
        if ((badValue < 0) || (pCVar4->PagesCount <= badValue)) {
          if (badValue != -1) {
            ErrorInt("[DEFDEVICE] invalid initial page",badValue,EARLY);
          }
          badValue = (uint)(iVar3 < pCVar4->PagesCount + -1) + iVar3;
        }
        iVar3 = badValue;
        pCVar4->initialPages[lVar5] = iVar3;
        lVar5 = lVar5 + 1;
      } while (lVar5 < pCVar4->SlotsCount);
      return;
    }
    message = "[DEFDEVICE] valid slot_size: 256..64ki, page_count: 1 or more";
  }
  Error(message,bp,EARLY);
  return;
}

Assistant:

static void dirDEFDEVICE() {
	//DEFDEVICE <deviceid>, <slot_size>, <page_count>[, <slot_0_initial_page>[, ...]]
	const char* id = GetID(lp);
	if (!id) {
		Error(DEFDEVICE_SYNTAX_ERR, bp, SUPPRESS);
		return;
	}

	const bool is_defined = std::any_of(
		DefDevices.begin(), DefDevices.end(),
		[&](const CDeviceDef* el) { return 0 == strcasecmp(id, el->getID()); }
	);
	if (is_defined || 1 < pass) {
		// same id defined twice during first pass?
		if (pass <= 1) Error("[DEFDEVICE] device with such ID is already defined", id, EARLY);
		// in later passes ignore the line, DEFDEVICE works only in first pass
		SkipToEol(lp);
		return;
	}

	// add new definition if arguments are correct and this is first pass
	aint args[2 + CDeviceDef::MAX_SLOT_N] = {};	// slot_size, page_count, initial pages, ...
	bool optional[2 + CDeviceDef::MAX_SLOT_N] = {false, false};
	aint &slot_size = args[0], &page_count = args[1], *initial_pages = args + 2;
	for (size_t i = 2; i < CDeviceDef::MAX_SLOT_N; ++i) {
		args[i] = -1;
		optional[i] = true;
	}
	if (!anyComma(lp) || !getIntArguments<2 + CDeviceDef::MAX_SLOT_N>(lp, args, optional)) {
		Error(DEFDEVICE_SYNTAX_ERR, bp, EARLY);
		return;
	}
	if (slot_size < 256 || 0x10000 < slot_size || page_count <= 0) {
		Error("[DEFDEVICE] valid slot_size: 256..64ki, page_count: 1 or more", bp, EARLY);
		return;
	}
	DefDevices.push_back(new CDeviceDef(id, slot_size, page_count));

	// init "initialPages array by going 0, 1, 2, ..., page_count-1, page_count-1, ... or parsed explicit values
	CDeviceDef & dev = *DefDevices.back();
	int previous_page = -1;
	for (int32_t i = 0; i < dev.SlotsCount; ++i) {
		if (0 <= initial_pages[i] && initial_pages[i] < dev.PagesCount) {
			previous_page = initial_pages[i];
		} else {
			if (-1 != initial_pages[i]) ErrorInt("[DEFDEVICE] invalid initial page", initial_pages[i], EARLY);
			if (previous_page < dev.PagesCount - 1) ++previous_page;
		}
		dev.initialPages[i] = previous_page;
	}
}